

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

void cfd::core::ConvertFromUniValue<unsigned_int>(uint *value,UniValue *json_value)

{
  bool bVar1;
  string *psVar2;
  CfdException *pCVar3;
  allocator local_111;
  string str;
  UniValue local_f0;
  string local_98;
  UniValue json_value_copy;
  
  UniValue::UniValue(&json_value_copy,json_value);
  if (json_value_copy.typ == VSTR) {
    psVar2 = UniValue::get_str_abi_cxx11_(json_value);
    ::std::__cxx11::string::string((string *)&str,(string *)psVar2);
    bVar1 = ::std::operator==(&str,"0n");
    if (bVar1) {
      ::std::__cxx11::string::string((string *)&local_98,"0",&local_111);
      UniValue::UniValue(&local_f0,VNUM,&local_98);
      UniValue::operator=(&json_value_copy,&local_f0);
      UniValue::~UniValue(&local_f0);
      ::std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      bVar1 = ::std::all_of<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(str._M_dataplus._M_p + (*str._M_dataplus._M_p == '-')),
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(str._M_dataplus._M_p + str._M_string_length),isdigit);
      if (bVar1) {
        psVar2 = UniValue::get_str_abi_cxx11_(json_value);
        UniValue::UniValue(&local_f0,VNUM,psVar2);
        UniValue::operator=(&json_value_copy,&local_f0);
        UniValue::~UniValue(&local_f0);
      }
    }
    ::std::__cxx11::string::~string((string *)&str);
  }
  if (json_value_copy.typ == VNUM) {
    str._M_dataplus._M_p = (pointer)UniValue::get_int64(&json_value_copy);
    if ((ulong)str._M_dataplus._M_p >> 0x20 == 0) {
      *value = (uint)str._M_dataplus._M_p;
      UniValue::~UniValue(&json_value_copy);
      return;
    }
    local_f0._0_8_ = "cfdcore_json_mapping_base.h";
    local_f0.val._M_dataplus._M_p._0_4_ = 0xef;
    local_f0.val._M_string_length = 0x4ff5f6;
    logger::warn<long_const&>
              ((CfdSourceLocation *)&local_f0,"Invalid json_value. : json_value={}",(long *)&str);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&local_f0,"Json value convert error. Value out of range.",
               (allocator *)&local_98);
    CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)&local_f0);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_f0._0_8_ = "cfdcore_json_mapping_base.h";
  local_f0.val._M_dataplus._M_p._0_4_ = 0x100;
  local_f0.val._M_string_length = 0x4ff5f6;
  logger::warn<>((CfdSourceLocation *)&local_f0,"Invalid json format.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_f0,"Json value convert error. Invalid json format.",(allocator *)&str)
  ;
  CfdException::CfdException(pCVar3,kCfdOutOfRangeError,(string *)&local_f0);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

inline void ConvertFromUniValue(
    T& value, const UniValue& json_value) {  // NOLINT
  using cfd::core::CfdError;
  using cfd::core::CfdException;
  using cfd::core::logger::warn;
  UniValue json_value_copy = json_value;
  if (json_value_copy.isStr()) {
    auto str = json_value.get_str();
    if (str == "0n") {
      json_value_copy = UniValue(UniValue::VNUM, "0");
    } else {
      auto begin_pos = str.begin();
      if (*begin_pos == '-') ++begin_pos;
      bool is_digits_only = std::all_of(begin_pos, str.end(), ::isdigit);
      // check max of int64 : execute call get_int64()
      if (is_digits_only) {
        json_value_copy = UniValue(UniValue::VNUM, json_value.get_str());
      }
    }
  }

  if (json_value_copy.isNum()) {
    const int64_t num = json_value_copy.get_int64();
    if (std::is_unsigned<T>::value) {
      uint64_t unsigned_num = static_cast<uint64_t>(num);
      uint64_t maximum = static_cast<uint64_t>(std::numeric_limits<T>::max());
      if ((num < 0) || (maximum < unsigned_num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    } else {
      int64_t maximum = static_cast<int64_t>(std::numeric_limits<T>::max());
      int64_t minimum = static_cast<int64_t>(std::numeric_limits<T>::min());
      if ((maximum < num) || (minimum > num)) {
        warn(CFD_LOG_SOURCE, "Invalid json_value. : json_value={}", num);
        throw CfdException(
            CfdError::kCfdOutOfRangeError,
            "Json value convert error. Value out of range.");
      }
    }
    value = static_cast<T>(num);
  } else {
    warn(CFD_LOG_SOURCE, "Invalid json format.");
    throw CfdException(
        CfdError::kCfdOutOfRangeError,
        "Json value convert error. Invalid json format.");
  }
}